

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O2

void __thiscall VTAdjacencyTest::checkMesh(VTAdjacencyTest *this,aiMesh *mesh)

{
  uint uVar1;
  aiFace *paVar2;
  long lVar3;
  uint qq;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  uint i;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  bool bVar9;
  AssertHelper local_b0;
  AssertionResult gtest_ar_;
  uint tt;
  AssertionResult gtest_ar;
  uint num;
  ulong local_58;
  VertexTriangleAdjacency adj;
  
  Assimp::VertexTriangleAdjacency::VertexTriangleAdjacency
            (&adj,mesh->mFaces,mesh->mNumFaces,mesh->mNumVertices,true);
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (mesh->mNumFaces <= uVar6) {
      puVar8 = adj.mAdjacencyTable;
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        gtest_ar_.success_ = true;
        gtest_ar_._1_3_ = 0xffffff;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_ar,"0xffffffff","*pi",(uint *)&gtest_ar_,puVar8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar5 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xcc,pcVar5);
          testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_b0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        puVar8 = puVar8 + 1;
      }
      uVar6 = 0;
      while (uVar6 < mesh->mNumFaces) {
        paVar2 = mesh->mFaces;
        local_58 = uVar6;
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          gtest_ar_.success_ = false;
          gtest_ar_._1_3_ = 0;
          puVar8 = adj.mLiveTriangles + paVar2[uVar6].mIndices[lVar4];
          testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                    ((internal *)&gtest_ar,"0U","piNum[idx]",(uint *)&gtest_ar_,puVar8);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            pcVar5 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                       ,0xd8,pcVar5);
            testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_b0);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar_);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          *puVar8 = *puVar8 - 1;
        }
        uVar6 = local_58 + 1;
      }
      for (uVar6 = 0; uVar6 < mesh->mNumVertices; uVar6 = uVar6 + 1) {
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_.success_ = adj.mLiveTriangles[uVar6] == 0;
        if (adj.mLiveTriangles[uVar6] != 0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"piNum[i]","true"
                     ,"false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&num,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                     ,0xe0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&num,(Message *)&local_b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&num);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_b0);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
      }
      Assimp::VertexTriangleAdjacency::~VertexTriangleAdjacency(&adj);
      return;
    }
    paVar2 = mesh->mFaces;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      uVar1 = paVar2[uVar6].mIndices[lVar4];
      num = adj.mLiveTriangles[uVar1];
      uVar1 = adj.mOffsetTable[uVar1];
      if (uVar7 < uVar1 + num) {
        uVar7 = uVar1 + num;
      }
      tt = 0;
      lVar3 = 0;
      while (num != (uint)lVar3) {
        if (uVar6 == adj.mAdjacencyTable[(ulong)uVar1 + lVar3]) {
          adj.mAdjacencyTable[(ulong)uVar1 + lVar3] = 0xffffffff;
          break;
        }
        lVar3 = lVar3 + 1;
        tt = (uint)lVar3;
      }
      testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"tt","num",&tt,&num);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar5 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVertexTriangleAdjacency.cpp"
                   ,0xc4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void VTAdjacencyTest::checkMesh(const aiMesh& mesh)
{
    VertexTriangleAdjacency adj(mesh.mFaces,mesh.mNumFaces,mesh.mNumVertices,true);

    unsigned int* const piNum = adj.mLiveTriangles;

    // check the primary adjacency table and check whether all faces
    // are contained in the list
    unsigned int maxOfs = 0;
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];
            const unsigned int num = piNum[idx];

            // go to this offset
            const unsigned int ofs = adj.mOffsetTable[idx];
            maxOfs = std::max(ofs+num,maxOfs);
            unsigned int* pi = &adj.mAdjacencyTable[ofs];

            // and search for us ...
            unsigned int tt = 0;
            for (; tt < num;++tt,++pi)
            {
                if (i == *pi)
                {
                    // mask our entry in the table. Finally all entries should be masked
                    *pi = 0xffffffff;

                    // there shouldn't be two entries for the same face
                    break;
                }
            }
            // assert if *this* vertex has not been found in the table
            EXPECT_LT(tt, num);
        }
    }

    // now check whether there are invalid faces
    const unsigned int* pi = adj.mAdjacencyTable;
    for (unsigned int i = 0; i < maxOfs;++i,++pi)
    {
        EXPECT_EQ(0xffffffff, *pi);
    }

    // check the numTrianglesPerVertex table
    for (unsigned int i = 0; i < mesh.mNumFaces;++i)
    {
        aiFace& face = mesh.mFaces[i];
        for (unsigned int qq = 0; qq < 3 ;++qq)
        {
            const unsigned int idx = face.mIndices[qq];

            // we should not reach 0 here ...
            EXPECT_NE(0U, piNum[idx]);
            piNum[idx]--;
        }
    }

    // check whether we reached 0 in all entries
    for (unsigned int i = 0; i < mesh.mNumVertices;++i)
    {
        EXPECT_FALSE(piNum[i]);
    }
}